

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2text_format.cc
# Opt level: O2

unique_ptr<S2Polygon,_std::default_delete<S2Polygon>_>
s2textformat::MakePolygonOrDie(string_view str,S2Debug debug_override)

{
  bool bVar1;
  ostream *poVar2;
  absl *this;
  S2Debug in_CL;
  size_type sVar3;
  undefined7 in_register_00000011;
  __uniq_ptr_data<S2Polygon,_std::default_delete<S2Polygon>,_true,_true> polygon;
  string_view piece;
  string_view str_00;
  S2LogMessage SStack_28;
  
  piece.ptr_ = (char *)CONCAT71(in_register_00000011,debug_override);
  polygon.super___uniq_ptr_impl<S2Polygon,_std::default_delete<S2Polygon>_>._M_t.
  super__Tuple_impl<0UL,_S2Polygon_*,_std::default_delete<S2Polygon>_>.
  super__Head_base<0UL,_S2Polygon_*,_false>._M_head_impl =
       (__uniq_ptr_impl<S2Polygon,_std::default_delete<S2Polygon>_>)str.ptr_;
  *(undefined8 *)
   polygon.super___uniq_ptr_impl<S2Polygon,_std::default_delete<S2Polygon>_>._M_t.
   super__Tuple_impl<0UL,_S2Polygon_*,_std::default_delete<S2Polygon>_>.
   super__Head_base<0UL,_S2Polygon_*,_false>._M_head_impl = 0;
  str_00.length_ = (size_type)piece.ptr_;
  str_00.ptr_ = (char *)str.length_;
  bVar1 = MakePolygon(str_00,(unique_ptr<S2Polygon,_std::default_delete<S2Polygon>_> *)
                             polygon.
                             super___uniq_ptr_impl<S2Polygon,_std::default_delete<S2Polygon>_>._M_t.
                             super__Tuple_impl<0UL,_S2Polygon_*,_std::default_delete<S2Polygon>_>.
                             super__Head_base<0UL,_S2Polygon_*,_false>._M_head_impl,in_CL);
  if (bVar1) {
    return (__uniq_ptr_data<S2Polygon,_std::default_delete<S2Polygon>,_true,_true>)
           (tuple<S2Polygon_*,_std::default_delete<S2Polygon>_>)
           polygon.super___uniq_ptr_impl<S2Polygon,_std::default_delete<S2Polygon>_>._M_t.
           super__Tuple_impl<0UL,_S2Polygon_*,_std::default_delete<S2Polygon>_>.
           super__Head_base<0UL,_S2Polygon_*,_false>._M_head_impl;
  }
  sVar3 = 3;
  S2LogMessage::S2LogMessage
            (&SStack_28,
             "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2text_format.cc"
             ,0xfa,kFatal,(ostream *)&std::cerr);
  poVar2 = std::operator<<(SStack_28.stream_,
                           "Check failed: MakePolygon(str, &polygon, debug_override) ");
  this = (absl *)std::operator<<(poVar2,": str == \"");
  piece.length_ = sVar3;
  poVar2 = absl::operator<<(this,(ostream *)str.length_,piece);
  std::operator<<(poVar2,"\"");
  abort();
}

Assistant:

unique_ptr<S2Polygon> MakePolygonOrDie(string_view str,
                                       S2Debug debug_override) {
  unique_ptr<S2Polygon> polygon;
  S2_CHECK(MakePolygon(str, &polygon, debug_override))
      << ": str == \"" << str << "\"";
  return polygon;
}